

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O2

void __thiscall
ObjTypeSpecFldInfoArray::EnsureArray
          (ObjTypeSpecFldInfoArray *this,Recycler *recycler,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *ptr;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b2,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) goto LAB_005a39ed;
    *puVar4 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b3,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar2) goto LAB_005a39ed;
    *puVar4 = 0;
  }
  uVar3 = Js::FunctionBody::GetInlineCacheCount(functionBody);
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b4,"(functionBody->GetInlineCacheCount() != 0)",
                       "functionBody->GetInlineCacheCount() != 0");
    if (!bVar2) goto LAB_005a39ed;
    *puVar4 = 0;
  }
  if ((this->infoArray).ptr == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    uVar3 = Js::FunctionBody::GetInlineCacheCount(functionBody);
    data.plusSize = (size_t)uVar3;
    local_50 = (undefined1  [8])&Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_1c2116b;
    data.filename._0_4_ = 0x4bc;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    uVar3 = Js::FunctionBody::GetInlineCacheCount(functionBody);
    ptr = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>,false>
                    ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar3);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>_>::WriteBarrierSet
              (&this->infoArray,ptr);
    uVar3 = Js::FunctionBody::GetInlineCacheCount(functionBody);
    this->infoCount = uVar3;
  }
  else {
    uVar3 = Js::FunctionBody::GetInlineCacheCount(functionBody);
    if (uVar3 != this->infoCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x4b8,"(functionBody->GetInlineCacheCount() == this->infoCount)",
                         "functionBody->GetInlineCacheCount() == this->infoCount");
      if (!bVar2) {
LAB_005a39ed:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void ObjTypeSpecFldInfoArray::EnsureArray(Recycler *const recycler, Js::FunctionBody *const functionBody)
{
    Assert(recycler != nullptr);
    Assert(functionBody != nullptr);
    Assert(functionBody->GetInlineCacheCount() != 0);

    if (this->infoArray)
    {
        Assert(functionBody->GetInlineCacheCount() == this->infoCount);
        return;
    }

    this->infoArray = RecyclerNewArrayZ(recycler, Field(ObjTypeSpecFldInfo*), functionBody->GetInlineCacheCount());
#if DBG
    this->infoCount = functionBody->GetInlineCacheCount();
#endif
}